

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O1

int zmq::get_peer_ip_address(fd_t sockfd_,string *ip_addr_)

{
  uint uVar1;
  char *pcVar2;
  zmq_socklen_t __salen;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  sockaddr_storage ss;
  char host [1025];
  sockaddr_storage local_4a8;
  char local_428 [1040];
  
  __salen = get_socket_address(sockfd_,socket_end_remote,&local_4a8);
  if (__salen == 0) {
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    uVar5 = 0;
    if (((uVar1 == 0x58) || (uVar1 == 9)) || (uVar1 == 0xe)) {
      get_peer_ip_address((zmq *)(ulong)uVar1);
    }
  }
  else {
    uVar5 = 0;
    iVar3 = getnameinfo((sockaddr *)&local_4a8,__salen,local_428,0x401,(char *)0x0,0,1);
    if (iVar3 == 0) {
      pcVar2 = (char *)ip_addr_->_M_string_length;
      strlen(local_428);
      std::__cxx11::string::_M_replace((ulong)ip_addr_,0,pcVar2,(ulong)local_428);
      uVar5 = (uint)local_4a8.ss_family;
    }
  }
  return uVar5;
}

Assistant:

int zmq::get_peer_ip_address (fd_t sockfd_, std::string &ip_addr_)
{
    struct sockaddr_storage ss;

    const zmq_socklen_t addrlen =
      get_socket_address (sockfd_, socket_end_remote, &ss);

    if (addrlen == 0) {
#ifdef ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error != WSANOTINITIALISED && last_error != WSAEFAULT
                    && last_error != WSAEINPROGRESS
                    && last_error != WSAENOTSOCK);
#elif !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EBADF && errno != EFAULT && errno != ENOTSOCK);
#else
        errno_assert (errno != EFAULT && errno != ENOTSOCK);
#endif
        return 0;
    }

    char host[NI_MAXHOST];
    const int rc =
      getnameinfo (reinterpret_cast<struct sockaddr *> (&ss), addrlen, host,
                   sizeof host, NULL, 0, NI_NUMERICHOST);
    if (rc != 0)
        return 0;

    ip_addr_ = host;

    union
    {
        struct sockaddr sa;
        struct sockaddr_storage sa_stor;
    } u;

    u.sa_stor = ss;
    return static_cast<int> (u.sa.sa_family);
}